

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Start_Resume_R_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Start_Resume_R_PDU::Decode
          (Start_Resume_R_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *stream_00;
  int iVar2;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Start_Resume_R_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar2 = 0;
  if ((local_19 & 1) != 0) {
    iVar2 = 0xc;
  }
  if ((uint)KVar1 + iVar2 < 0x30) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(this_00,&local_40,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  Simulation_Management_Header::Decode
            ((Simulation_Management_Header *)this,pKStack_18,(bool)(local_19 & 1));
  stream_00 = DATA_TYPE::operator>>
                        (pKStack_18,
                         &(this->super_Start_Resume_PDU).m_RealWorldTime.super_DataTypeBase);
  DATA_TYPE::operator>>(stream_00,&(this->super_Start_Resume_PDU).m_SimTime.super_DataTypeBase);
  Reliability_Header::Decode(&this->super_Reliability_Header,pKStack_18);
  KDataStream::operator>>(pKStack_18,&(this->super_Start_Resume_PDU).m_ui32RequestID);
  return;
}

Assistant:

void Start_Resume_R_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < START_RESUME_R_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Simulation_Management_Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_RealWorldTime
           >> KDIS_STREAM m_SimTime;

    Reliability_Header::Decode( stream );

    stream >> m_ui32RequestID;
}